

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

bool __thiscall tetgenio::load_medit(tetgenio *this,char *filebasename,int istetmesh)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined4 uVar11;
  int iVar12;
  size_t sVar13;
  FILE *__stream;
  long lVar14;
  ulong uVar15;
  double *pdVar16;
  int *piVar17;
  facet *pfVar18;
  facet *ctx;
  polygon *ppVar19;
  facet *pfVar20;
  double dVar21;
  uint local_c94;
  int local_c90;
  int smallestidx;
  int j;
  int i;
  int *plist;
  int corners;
  int line_count;
  int ntets;
  int nfaces;
  int nverts;
  int dimension;
  int *tmpfmlist;
  double *coord;
  char *str;
  char *bufferp;
  char buffer [2048];
  char infilename [1024];
  polygon *p;
  facet *f;
  facet *tmpflist;
  FILE *fp;
  int istetmesh_local;
  char *filebasename_local;
  tetgenio *this_local;
  
  nfaces = 0;
  ntets = 0;
  line_count = 0;
  corners = 0;
  plist._4_4_ = 0;
  plist._0_4_ = 0;
  local_c94 = 0;
  strncpy(buffer + 0x7f8,filebasename,0x3ff);
  if (buffer[0x7f8] == '\0') {
    printf("Error:  No filename.\n");
  }
  else {
    sVar13 = strlen(buffer + 0x7f8);
    iVar12 = strcmp(buffer + sVar13 + 0x7f3,".mesh");
    if (iVar12 != 0) {
      strcat(buffer + 0x7f8,".mesh");
    }
    __stream = fopen(buffer + 0x7f8,"r");
    if (__stream != (FILE *)0x0) {
      printf("Opening %s.\n",buffer + 0x7f8);
      do {
        while( true ) {
          do {
            str = readline(this,(char *)&bufferp,(FILE *)__stream,(int *)((long)&plist + 4));
            if (str == (char *)0x0) {
              fclose(__stream);
              if (local_c94 == 0) {
                this->firstnumber = 0;
              }
              else {
                if (local_c94 != 1) {
                  printf("A wrong smallest index (%d) was detected in file %s\n",(ulong)local_c94,
                         buffer + 0x7f8);
                  return false;
                }
                this->firstnumber = 1;
              }
              return true;
            }
          } while (*str == '#');
          if (nfaces == 0) {
            coord = (double *)strstr(str,"Dimension");
            if (coord == (double *)0x0) {
              coord = (double *)strstr(str,"dimension");
            }
            if (coord == (double *)0x0) {
              coord = (double *)strstr(str,"DIMENSION");
            }
            if (coord != (double *)0x0) {
              str = findnextnumber(this,(char *)coord);
              if (*str == '\0') {
                str = readline(this,(char *)&bufferp,(FILE *)__stream,(int *)((long)&plist + 4));
              }
              lVar14 = strtol(str,&str,0);
              nfaces = (int)lVar14;
              if ((nfaces != 2) && (nfaces != 3)) {
                printf("Unknown dimension in file on line %d in file %s\n",(ulong)plist._4_4_,
                       buffer + 0x7f8);
                fclose(__stream);
                return false;
              }
              this->mesh_dim = nfaces;
            }
          }
          if (ntets == 0) break;
LAB_0010ffa5:
          if (corners == 0) {
            plist._0_4_ = 0;
            coord = (double *)strstr(str,"Tetrahedra");
            if (coord == (double *)0x0) {
              coord = (double *)strstr(str,"tetrahedra");
            }
            if (coord == (double *)0x0) {
              coord = (double *)strstr(str,"TETRAHEDRA");
            }
            if (coord != (double *)0x0) {
              plist._0_4_ = 4;
            }
            if ((int)plist == 4) {
              str = findnextnumber(this,(char *)coord);
              if (*str == '\0') {
                str = readline(this,(char *)&bufferp,(FILE *)__stream,(int *)((long)&plist + 4));
              }
              lVar14 = strtol(str,&str,0);
              corners = (int)lVar14;
              if (0 < corners) {
                this->numberoftetrahedra = corners;
                this->numberofcorners = 4;
                this->numberoftetrahedronattributes = 1;
                auVar2._8_8_ = 0;
                auVar2._0_8_ = (long)(corners << 2);
                uVar15 = SUB168(auVar2 * ZEXT816(4),0);
                if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
                  uVar15 = 0xffffffffffffffff;
                }
                piVar17 = (int *)operator_new__(uVar15);
                this->tetrahedronlist = piVar17;
                auVar3._8_8_ = 0;
                auVar3._0_8_ = (long)corners;
                uVar15 = SUB168(auVar3 * ZEXT816(8),0);
                if (SUB168(auVar3 * ZEXT816(8),8) != 0) {
                  uVar15 = 0xffffffffffffffff;
                }
                pdVar16 = (double *)operator_new__(uVar15);
                this->tetrahedronattributelist = pdVar16;
              }
            }
            for (smallestidx = 0; smallestidx < this->numberoftetrahedra;
                smallestidx = smallestidx + 1) {
              piVar17 = this->tetrahedronlist;
              iVar12 = smallestidx << 2;
              str = readline(this,(char *)&bufferp,(FILE *)__stream,(int *)((long)&plist + 4));
              if (str == (char *)0x0) {
                printf("Unexpected end of file on line %d in file %s\n",(ulong)plist._4_4_,
                       buffer + 0x7f8);
                fclose(__stream);
                return false;
              }
              for (local_c90 = 0; local_c90 < (int)plist; local_c90 = local_c90 + 1) {
                if (*str == '\0') {
                  printf("Syntax error reading face on line %d in file %s\n",(ulong)plist._4_4_,
                         buffer + 0x7f8);
                  fclose(__stream);
                  return false;
                }
                lVar14 = strtol(str,&str,0);
                piVar17[(long)iVar12 + (long)local_c90] = (int)lVar14;
                if (piVar17[(long)iVar12 + (long)local_c90] < (int)local_c94) {
                  local_c94 = piVar17[(long)iVar12 + (long)local_c90];
                }
                str = findnextnumber(this,str);
              }
              this->tetrahedronattributelist[smallestidx] = 0.0;
              if (*str != '\0') {
                lVar14 = strtol(str,&str,0);
                this->tetrahedronattributelist[smallestidx] = (double)lVar14;
              }
            }
          }
          if (line_count == 0) {
            plist._0_4_ = 0;
            coord = (double *)strstr(str,"Triangles");
            if (coord == (double *)0x0) {
              coord = (double *)strstr(str,"triangles");
            }
            if (coord == (double *)0x0) {
              coord = (double *)strstr(str,"TRIANGLES");
            }
            if (coord == (double *)0x0) {
              coord = (double *)strstr(str,"Quadrilaterals");
              if (coord == (double *)0x0) {
                coord = (double *)strstr(str,"quadrilaterals");
              }
              if (coord == (double *)0x0) {
                coord = (double *)strstr(str,"QUADRILATERALS");
              }
              if (coord != (double *)0x0) {
                plist._0_4_ = 4;
              }
            }
            else {
              plist._0_4_ = 3;
            }
            if (((int)plist == 3) || ((int)plist == 4)) {
              str = findnextnumber(this,(char *)coord);
              if (*str == '\0') {
                str = readline(this,(char *)&bufferp,(FILE *)__stream,(int *)((long)&plist + 4));
              }
              lVar14 = strtol(str,&str,0);
              line_count = (int)lVar14;
              if (0 < line_count) {
                if (istetmesh == 0) {
                  if (this->numberoffacets < 1) {
                    auVar6._8_8_ = 0;
                    auVar6._0_8_ = (long)line_count;
                    uVar15 = SUB168(auVar6 * ZEXT816(0x20),0);
                    if (SUB168(auVar6 * ZEXT816(0x20),8) != 0) {
                      uVar15 = 0xffffffffffffffff;
                    }
                    pfVar18 = (facet *)operator_new__(uVar15);
                    this->facetlist = pfVar18;
                    auVar7._8_8_ = 0;
                    auVar7._0_8_ = (long)line_count;
                    uVar15 = SUB168(auVar7 * ZEXT816(4),0);
                    if (SUB168(auVar7 * ZEXT816(4),8) != 0) {
                      uVar15 = 0xffffffffffffffff;
                    }
                    piVar17 = (int *)operator_new__(uVar15);
                    this->facetmarkerlist = piVar17;
                  }
                  else {
                    auVar4._8_8_ = 0;
                    auVar4._0_8_ = (long)(this->numberoffacets + line_count);
                    uVar15 = SUB168(auVar4 * ZEXT816(0x20),0);
                    if (SUB168(auVar4 * ZEXT816(0x20),8) != 0) {
                      uVar15 = 0xffffffffffffffff;
                    }
                    pfVar18 = (facet *)operator_new__(uVar15);
                    auVar5._8_8_ = 0;
                    auVar5._0_8_ = (long)(this->numberoffacets + line_count);
                    uVar15 = SUB168(auVar5 * ZEXT816(4),0);
                    if (SUB168(auVar5 * ZEXT816(4),8) != 0) {
                      uVar15 = 0xffffffffffffffff;
                    }
                    _nverts = (int *)operator_new__(uVar15);
                    for (smallestidx = 0; smallestidx < this->numberoffacets;
                        smallestidx = smallestidx + 1) {
                      ctx = pfVar18 + smallestidx;
                      init((EVP_PKEY_CTX *)ctx);
                      pfVar20 = this->facetlist + smallestidx;
                      ctx->polygonlist = pfVar20->polygonlist;
                      uVar11 = *(undefined4 *)&pfVar20->field_0xc;
                      ctx->numberofpolygons = pfVar20->numberofpolygons;
                      *(undefined4 *)&ctx->field_0xc = uVar11;
                      ctx->holelist = pfVar20->holelist;
                      uVar11 = *(undefined4 *)&pfVar20->field_0x1c;
                      ctx->numberofholes = pfVar20->numberofholes;
                      *(undefined4 *)&ctx->field_0x1c = uVar11;
                      _nverts[smallestidx] = this->facetmarkerlist[smallestidx];
                    }
                    if (this->facetlist != (facet *)0x0) {
                      operator_delete__(this->facetlist);
                    }
                    if (this->facetmarkerlist != (int *)0x0) {
                      operator_delete__(this->facetmarkerlist);
                    }
                    this->facetlist = pfVar18;
                    this->facetmarkerlist = _nverts;
                  }
                }
                else if ((int)plist == 3) {
                  this->numberoftrifaces = line_count;
                  auVar8._8_8_ = 0;
                  auVar8._0_8_ = (long)(line_count * 3);
                  uVar15 = SUB168(auVar8 * ZEXT816(4),0);
                  if (SUB168(auVar8 * ZEXT816(4),8) != 0) {
                    uVar15 = 0xffffffffffffffff;
                  }
                  piVar17 = (int *)operator_new__(uVar15);
                  this->trifacelist = piVar17;
                  auVar9._8_8_ = 0;
                  auVar9._0_8_ = (long)line_count;
                  uVar15 = SUB168(auVar9 * ZEXT816(4),0);
                  if (SUB168(auVar9 * ZEXT816(4),8) != 0) {
                    uVar15 = 0xffffffffffffffff;
                  }
                  piVar17 = (int *)operator_new__(uVar15);
                  this->trifacemarkerlist = piVar17;
                }
              }
              if (istetmesh == 0) {
                for (smallestidx = this->numberoffacets;
                    smallestidx < this->numberoffacets + line_count; smallestidx = smallestidx + 1)
                {
                  str = readline(this,(char *)&bufferp,(FILE *)__stream,(int *)((long)&plist + 4));
                  if (str == (char *)0x0) {
                    printf("Unexpected end of file on line %d in file %s\n",(ulong)plist._4_4_,
                           buffer + 0x7f8);
                    fclose(__stream);
                    return false;
                  }
                  pfVar18 = this->facetlist + smallestidx;
                  init((EVP_PKEY_CTX *)pfVar18);
                  pfVar18->numberofpolygons = 1;
                  ppVar19 = (polygon *)operator_new__(0x10);
                  pfVar18->polygonlist = ppVar19;
                  ppVar19 = pfVar18->polygonlist;
                  init((EVP_PKEY_CTX *)ppVar19);
                  ppVar19->numberofvertices = (int)plist;
                  auVar10._8_8_ = 0;
                  auVar10._0_8_ = (long)ppVar19->numberofvertices;
                  uVar15 = SUB168(auVar10 * ZEXT816(4),0);
                  if (SUB168(auVar10 * ZEXT816(4),8) != 0) {
                    uVar15 = 0xffffffffffffffff;
                  }
                  piVar17 = (int *)operator_new__(uVar15);
                  ppVar19->vertexlist = piVar17;
                  for (local_c90 = 0; local_c90 < (int)plist; local_c90 = local_c90 + 1) {
                    if (*str == '\0') {
                      printf("Syntax error reading face on line %d in file %s\n",(ulong)plist._4_4_,
                             buffer + 0x7f8);
                      fclose(__stream);
                      return false;
                    }
                    lVar14 = strtol(str,&str,0);
                    ppVar19->vertexlist[local_c90] = (int)lVar14;
                    if (ppVar19->vertexlist[local_c90] < (int)local_c94) {
                      local_c94 = ppVar19->vertexlist[local_c90];
                    }
                    str = findnextnumber(this,str);
                  }
                  this->facetmarkerlist[smallestidx] = 0;
                  if (*str != '\0') {
                    lVar14 = strtol(str,&str,0);
                    this->facetmarkerlist[smallestidx] = (int)lVar14;
                  }
                }
                this->numberoffacets = line_count + this->numberoffacets;
                line_count = 0;
              }
              else if ((int)plist == 3) {
                for (smallestidx = 0; smallestidx < this->numberoftrifaces;
                    smallestidx = smallestidx + 1) {
                  piVar17 = this->trifacelist;
                  str = readline(this,(char *)&bufferp,(FILE *)__stream,(int *)((long)&plist + 4));
                  if (str == (char *)0x0) {
                    printf("Unexpected end of file on line %d in file %s\n",(ulong)plist._4_4_,
                           buffer + 0x7f8);
                    fclose(__stream);
                    return false;
                  }
                  for (local_c90 = 0; local_c90 < (int)plist; local_c90 = local_c90 + 1) {
                    if (*str == '\0') {
                      printf("Syntax error reading face on line %d in file %s\n",(ulong)plist._4_4_,
                             buffer + 0x7f8);
                      fclose(__stream);
                      return false;
                    }
                    lVar14 = strtol(str,&str,0);
                    piVar17[(long)(smallestidx * 3) + (long)local_c90] = (int)lVar14;
                    if (piVar17[(long)(smallestidx * 3) + (long)local_c90] < (int)local_c94) {
                      local_c94 = piVar17[(long)(smallestidx * 3) + (long)local_c90];
                    }
                    str = findnextnumber(this,str);
                  }
                  this->trifacemarkerlist[smallestidx] = 0;
                  if (*str != '\0') {
                    lVar14 = strtol(str,&str,0);
                    this->trifacemarkerlist[smallestidx] = (int)lVar14;
                  }
                }
              }
            }
          }
        }
        coord = (double *)strstr(str,"Vertices");
        if (coord == (double *)0x0) {
          coord = (double *)strstr(str,"vertices");
        }
        if (coord == (double *)0x0) {
          coord = (double *)strstr(str,"VERTICES");
        }
        if (coord == (double *)0x0) goto LAB_0010ffa5;
        str = findnextnumber(this,(char *)coord);
        if (*str == '\0') {
          str = readline(this,(char *)&bufferp,(FILE *)__stream,(int *)((long)&plist + 4));
        }
        lVar14 = strtol(str,&str,0);
        ntets = (int)lVar14;
        local_c94 = ntets + 1;
        if (0 < ntets) {
          this->numberofpoints = ntets;
          auVar1._8_8_ = 0;
          auVar1._0_8_ = (long)(ntets * 3);
          uVar15 = SUB168(auVar1 * ZEXT816(8),0);
          if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
            uVar15 = 0xffffffffffffffff;
          }
          pdVar16 = (double *)operator_new__(uVar15);
          this->pointlist = pdVar16;
        }
        for (smallestidx = 0; smallestidx < ntets; smallestidx = smallestidx + 1) {
          str = readline(this,(char *)&bufferp,(FILE *)__stream,(int *)((long)&plist + 4));
          if (str == (char *)0x0) {
            printf("Unexpected end of file on line %d in file %s\n",(ulong)plist._4_4_,
                   buffer + 0x7f8);
            fclose(__stream);
            return false;
          }
          tmpfmlist = (int *)(this->pointlist + smallestidx * 3);
          for (local_c90 = 0; local_c90 < 3; local_c90 = local_c90 + 1) {
            if (*str == '\0') {
              printf("Syntax error reading vertex coords on line");
              printf(" %d in file %s\n",(ulong)plist._4_4_,buffer + 0x7f8);
              fclose(__stream);
              return false;
            }
            if ((local_c90 < 2) || (nfaces == 3)) {
              dVar21 = strtod(str,&str);
              *(double *)(tmpfmlist + (long)local_c90 * 2) = dVar21;
            }
            else {
              (tmpfmlist + (long)local_c90 * 2)[0] = 0;
              (tmpfmlist + (long)local_c90 * 2)[1] = 0;
            }
            str = findnextnumber(this,str);
          }
        }
      } while( true );
    }
    printf("Error:  Unable to open file %s\n",buffer + 0x7f8);
  }
  return false;
}

Assistant:

bool tetgenio::load_medit(char* filebasename, int istetmesh)
{
  FILE *fp;
  tetgenio::facet *tmpflist, *f;
  tetgenio::polygon *p;
  char infilename[FILENAMESIZE];
  char buffer[INPUTLINESIZE];
  char *bufferp, *str;
  double *coord;
  int *tmpfmlist;
  int dimension = 0;
  int nverts = 0;
  int nfaces = 0;
  int ntets = 0;
  int line_count = 0;
  int corners = 0; // 3 (triangle) or 4 (quad).
  int *plist;
  int i, j;

  int smallestidx = 0;

  strncpy(infilename, filebasename, FILENAMESIZE - 1);
  infilename[FILENAMESIZE - 1] = '\0';
  if (infilename[0] == '\0') {
    printf("Error:  No filename.\n");
    return false;
  }
  if (strcmp(&infilename[strlen(infilename) - 5], ".mesh") != 0) {
    strcat(infilename, ".mesh");
  }
  
  if (!(fp = fopen(infilename, "r"))) {
    printf("Error:  Unable to open file %s\n", infilename);
    return false;
  }
  printf("Opening %s.\n", infilename);

  while ((bufferp = readline(buffer, fp, &line_count)) != NULL) {
    if (*bufferp == '#') continue;  // A comment line is skipped.
    if (dimension == 0) {
      // Find if it is the keyword "Dimension".
      str = strstr(bufferp, "Dimension");
      if (!str) str = strstr(bufferp, "dimension");
      if (!str) str = strstr(bufferp, "DIMENSION");
      if (str) {
        // Read the dimensions
        bufferp = findnextnumber(str); // Skip field "Dimension".
        if (*bufferp == '\0') {
          // Read a non-empty line.
          bufferp = readline(buffer, fp, &line_count);
        }
        dimension = (int) strtol(bufferp, &bufferp, 0);
        if (dimension != 2 && dimension != 3) {
          printf("Unknown dimension in file on line %d in file %s\n",
                 line_count, infilename);
          fclose(fp);
          return false;
        }
        mesh_dim = dimension;
      }
    }
    if (nverts == 0) {
      // Find if it is the keyword "Vertices".
      str = strstr(bufferp, "Vertices");
      if (!str) str = strstr(bufferp, "vertices");
      if (!str) str = strstr(bufferp, "VERTICES");
      if (str) {
        // Read the number of vertices.
        bufferp = findnextnumber(str); // Skip field "Vertices".
        if (*bufferp == '\0') {
          // Read a non-empty line.
          bufferp = readline(buffer, fp, &line_count);
        }
        nverts = (int) strtol(bufferp, &bufferp, 0);
        // Initialize the smallest index.
        smallestidx = nverts + 1;
        // Allocate memory for 'tetgenio'
        if (nverts > 0) {
          numberofpoints = nverts;
          pointlist = new REAL[nverts * 3];
        }
        // Read the follwoing node list.
        for (i = 0; i < nverts; i++) {
          bufferp = readline(buffer, fp, &line_count);
          if (bufferp == NULL) {
            printf("Unexpected end of file on line %d in file %s\n",
                   line_count, infilename);
            fclose(fp);
            return false;
          }
          // Read vertex coordinates
          coord = &pointlist[i * 3];
          for (j = 0; j < 3; j++) {
            if (*bufferp == '\0') {
              printf("Syntax error reading vertex coords on line");
              printf(" %d in file %s\n", line_count, infilename);
              fclose(fp);
              return false;
            }
            if ((j < 2) || (dimension == 3)) {
              coord[j] = (REAL) strtod(bufferp, &bufferp);
            } else {
              coord[j] = 0.0;
            }
            bufferp = findnextnumber(bufferp);
          }
        }
        continue;
      }
    }
    if (ntets == 0) {
      // Find if it is the keyword "Tetrahedra"
      corners = 0;
      str = strstr(bufferp, "Tetrahedra");
      if (!str) str = strstr(bufferp, "tetrahedra");
      if (!str) str = strstr(bufferp, "TETRAHEDRA");
      if (str) {
        corners = 4;
      }
      if (corners == 4) {
        // Read the number of tetrahedra
        bufferp = findnextnumber(str); // Skip field "Tetrahedra".
        if (*bufferp == '\0') {
          // Read a non-empty line.
          bufferp = readline(buffer, fp, &line_count);
        }
        ntets = strtol(bufferp, &bufferp, 0);
        if (ntets > 0) {
          // It is a tetrahedral mesh.
          numberoftetrahedra = ntets;
          numberofcorners = 4;
          numberoftetrahedronattributes = 1;
          tetrahedronlist = new int[ntets * 4];
          tetrahedronattributelist = new REAL[ntets];
        }
      } // if (corners == 4)
      // Read the list of tetrahedra.
      for (i = 0; i < numberoftetrahedra; i++) {
        plist = &(tetrahedronlist[i * 4]);
        bufferp = readline(buffer, fp, &line_count);
        if (bufferp == NULL) {
          printf("Unexpected end of file on line %d in file %s\n",
                 line_count, infilename);
          fclose(fp);
          return false;
        }
        // Read the vertices of the tet.
        for (j = 0; j < corners; j++) {
          if (*bufferp == '\0') {
            printf("Syntax error reading face on line %d in file %s\n",
                   line_count, infilename);
            fclose(fp);
            return false;
          }
          plist[j] = (int) strtol(bufferp, &bufferp, 0);
          // Remember the smallest index.
          if (plist[j] < smallestidx) smallestidx = plist[j];
          bufferp = findnextnumber(bufferp);
        }
        // Read the attribute of the tet if it exists.
        tetrahedronattributelist[i] = 0;
        if (*bufferp != '\0') {
          tetrahedronattributelist[i] = (REAL) strtol(bufferp, &bufferp, 0);
        }
      } // i
    } // Tetrahedra
    if (nfaces == 0) {
      // Find if it is the keyword "Triangles" or "Quadrilaterals".
      corners = 0;
      str = strstr(bufferp, "Triangles");
      if (!str) str = strstr(bufferp, "triangles");
      if (!str) str = strstr(bufferp, "TRIANGLES");
      if (str) {
        corners = 3;
      } else {
        str = strstr(bufferp, "Quadrilaterals");
        if (!str) str = strstr(bufferp, "quadrilaterals");
        if (!str) str = strstr(bufferp, "QUADRILATERALS");
        if (str) {
          corners = 4;
        }
      }
      if (corners == 3 || corners == 4) {
        // Read the number of triangles (or quadrilaterals).
        bufferp = findnextnumber(str); // Skip field "Triangles".
        if (*bufferp == '\0') {
          // Read a non-empty line.
          bufferp = readline(buffer, fp, &line_count);
        }
        nfaces = strtol(bufferp, &bufferp, 0);
        // Allocate memory for 'tetgenio'
        if (nfaces > 0) {
          if (!istetmesh) {
            // It is a PLC surface mesh.
            if (numberoffacets > 0) {
              // facetlist has already been allocated. Enlarge arrays.
              // This happens when the surface mesh contains mixed cells.
              tmpflist = new tetgenio::facet[numberoffacets + nfaces];
              tmpfmlist = new int[numberoffacets + nfaces];
              // Copy the data of old arrays into new arrays.
              for (i = 0; i < numberoffacets; i++) {
                f = &(tmpflist[i]);
                tetgenio::init(f);
                *f = facetlist[i];
                tmpfmlist[i] = facetmarkerlist[i];
              }
              // Release old arrays.
              delete [] facetlist;
              delete [] facetmarkerlist;
              // Remember the new arrays.
              facetlist = tmpflist;
              facetmarkerlist = tmpfmlist;
            } else {
              // This is the first time to allocate facetlist.
              facetlist = new tetgenio::facet[nfaces];
              facetmarkerlist = new int[nfaces];
            }
          } else {
            if (corners == 3) {
              // It is a surface mesh of a tetrahedral mesh.
              numberoftrifaces = nfaces;
              trifacelist = new int[nfaces * 3];
              trifacemarkerlist = new int[nfaces];
            }
          }
        } // if (nfaces > 0)
        // Read the following list of faces.
        if (!istetmesh) {
          for (i = numberoffacets; i < numberoffacets + nfaces; i++) {
            bufferp = readline(buffer, fp, &line_count);
            if (bufferp == NULL) {
              printf("Unexpected end of file on line %d in file %s\n",
                     line_count, infilename);
              fclose(fp);
              return false;
            }
            f = &facetlist[i];
            tetgenio::init(f);
            // In .mesh format, each facet has one polygon, no hole.
            f->numberofpolygons = 1;
            f->polygonlist = new tetgenio::polygon[1];
            p = &f->polygonlist[0];
            tetgenio::init(p);
            p->numberofvertices = corners;
            // Allocate memory for face vertices
            p->vertexlist = new int[p->numberofvertices];
            // Read the vertices of the face.
            for (j = 0; j < corners; j++) {
              if (*bufferp == '\0') {
                printf("Syntax error reading face on line %d in file %s\n",
                       line_count, infilename);
                fclose(fp);
                return false;
              }
              p->vertexlist[j] = (int) strtol(bufferp, &bufferp, 0);
              // Remember the smallest index.
              if (p->vertexlist[j] < smallestidx) {
                smallestidx = p->vertexlist[j];
              }
              bufferp = findnextnumber(bufferp);
            }
            // Read the marker of the face if it exists.
            facetmarkerlist[i] = 0;
            if (*bufferp != '\0') {
              facetmarkerlist[i] = (int) strtol(bufferp, &bufferp, 0);
            }
          }
          // Have read in a list of triangles/quads.
          numberoffacets += nfaces;
          nfaces = 0;
        } else {
          // It is a surface mesh of a tetrahedral mesh.
          if (corners == 3) {
            for (i = 0; i < numberoftrifaces; i++) {
              plist = &(trifacelist[i * 3]);
              bufferp = readline(buffer, fp, &line_count);
              if (bufferp == NULL) {
                printf("Unexpected end of file on line %d in file %s\n",
                       line_count, infilename);
                fclose(fp);
                return false;
              }
              // Read the vertices of the face.
              for (j = 0; j < corners; j++) {
                if (*bufferp == '\0') {
                  printf("Syntax error reading face on line %d in file %s\n",
                         line_count, infilename);
                  fclose(fp);
                  return false;
                }
                plist[j] = (int) strtol(bufferp, &bufferp, 0);
                // Remember the smallest index.
                if (plist[j] < smallestidx) {
                  smallestidx = plist[j];
                }
                bufferp = findnextnumber(bufferp);
              }
              // Read the marker of the face if it exists.
              trifacemarkerlist[i] = 0;
              if (*bufferp != '\0') {
                trifacemarkerlist[i] = (int) strtol(bufferp, &bufferp, 0);
              }
            } // i
          } // if (corners == 3)
        } // if (b->refine)
      } // if (corners == 3 || corners == 4)
    }
  }

  // Close file
  fclose(fp);

  // Decide the firstnumber of the index.
  if (smallestidx == 0) {
    firstnumber = 0;  
  } else if (smallestidx == 1) {
    firstnumber = 1;
  } else {
    printf("A wrong smallest index (%d) was detected in file %s\n",
           smallestidx, infilename);
    return false;
  }

  return true;
}